

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeMemberAccess(ExpressionContext *ctx,SynMemberAccess *syntax)

{
  TypeBase *pTVar1;
  int iVar2;
  TypeBase *pTVar3;
  undefined4 extraout_var;
  ExprBase *pEVar4;
  undefined4 extraout_var_00;
  ExprBase *unaff_R15;
  bool bVar5;
  
  pTVar3 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  if (pTVar3 != (TypeBase *)0x0) {
    if (pTVar3 == ctx->typeAuto) {
      anon_unknown.dwarf_11255e::Stop
                (ctx,&syntax->super_SynBase,"ERROR: cannot take typeid from auto type");
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    unaff_R15 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeTypeID;
    unaff_R15->typeID = 8;
    unaff_R15->source = &syntax->super_SynBase;
    unaff_R15->type = pTVar1;
    unaff_R15->next = (ExprBase *)0x0;
    unaff_R15->listed = false;
    unaff_R15->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6558;
    unaff_R15[1]._vptr_ExprBase = (_func_int **)pTVar3;
  }
  if (pTVar3 == (TypeBase *)0x0) {
    pTVar3 = AnalyzeType(ctx,syntax->value,false,(bool *)0x0);
    if (pTVar3 == (TypeBase *)0x0) {
      bVar5 = true;
    }
    else {
      pEVar4 = CreateTypeidMemberAccess(ctx,&syntax->super_SynBase,pTVar3,syntax->member);
      bVar5 = pEVar4 == (ExprBase *)0x0;
      if (!bVar5) {
        unaff_R15 = pEVar4;
      }
    }
    if (bVar5) {
      pEVar4 = AnalyzeExpression(ctx,syntax->value);
      if ((pEVar4->type == (TypeBase *)0x0) || (pEVar4->type->typeID != 0)) {
        pEVar4 = CreateMemberAccess(ctx,&syntax->super_SynBase,pEVar4,syntax->member,false);
        return pEVar4;
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      unaff_R15 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
      pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      unaff_R15->typeID = 0x1a;
      unaff_R15->source = &syntax->super_SynBase;
      unaff_R15->type = pTVar3;
      unaff_R15->next = (ExprBase *)0x0;
      unaff_R15->listed = false;
      unaff_R15->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6788;
      unaff_R15[1]._vptr_ExprBase = (_func_int **)pEVar4;
      *(undefined8 *)&unaff_R15[1].typeID = 0;
    }
  }
  return unaff_R15;
}

Assistant:

ExprBase* AnalyzeMemberAccess(ExpressionContext &ctx, SynMemberAccess *syntax)
{
	// It could be a typeid
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
	{
		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);
	}

	// It could be a type property
	if(TypeBase *type = AnalyzeType(ctx, syntax->value, false))
	{
		if(ExprBase *result = CreateTypeidMemberAccess(ctx, syntax, type, syntax->member))
			return result;
	}

	ExprBase* value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(syntax, ctx.GetErrorType(), value, NULL);

	return CreateMemberAccess(ctx, syntax, value, syntax->member, false);
}